

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupSegmentTree::Initialize(RowGroupSegmentTree *this,PersistentTableData *data)

{
  _Head_base<0UL,_duckdb::MetadataReader_*,_false> _Var1;
  _Head_base<0UL,_duckdb::MetadataReader_*,_false> _Var2;
  MetadataManager *args;
  _Head_base<0UL,_duckdb::MetadataReader_*,_false> local_20;
  
  this->current_row_group = 0;
  this->max_row_group = data->row_group_count;
  LOCK();
  (this->super_SegmentTree<duckdb::RowGroup,_true>).finished_loading._M_base._M_i = false;
  UNLOCK();
  args = RowGroupCollection::GetMetadataManager(this->collection);
  make_uniq<duckdb::MetadataReader,duckdb::MetadataManager&,duckdb::MetaBlockPointer&>
            ((duckdb *)&local_20,args,&data->block_pointer);
  _Var2._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (MetadataReader *)0x0;
  _Var1._M_head_impl =
       (this->reader).
       super_unique_ptr<duckdb::MetadataReader,_std::default_delete<duckdb::MetadataReader>_>._M_t.
       super___uniq_ptr_impl<duckdb::MetadataReader,_std::default_delete<duckdb::MetadataReader>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::MetadataReader_*,_std::default_delete<duckdb::MetadataReader>_>
       .super__Head_base<0UL,_duckdb::MetadataReader_*,_false>._M_head_impl;
  (this->reader).
  super_unique_ptr<duckdb::MetadataReader,_std::default_delete<duckdb::MetadataReader>_>._M_t.
  super___uniq_ptr_impl<duckdb::MetadataReader,_std::default_delete<duckdb::MetadataReader>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::MetadataReader_*,_std::default_delete<duckdb::MetadataReader>_>.
  super__Head_base<0UL,_duckdb::MetadataReader_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (MetadataReader *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_ReadStream + 0x10))();
    if (local_20._M_head_impl != (MetadataReader *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 0x10))();
    }
  }
  return;
}

Assistant:

void RowGroupSegmentTree::Initialize(PersistentTableData &data) {
	D_ASSERT(data.row_group_count > 0);
	current_row_group = 0;
	max_row_group = data.row_group_count;
	finished_loading = false;
	reader = make_uniq<MetadataReader>(collection.GetMetadataManager(), data.block_pointer);
}